

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumenter.cpp
# Opt level: O1

void __thiscall wasm::Instrumenter::addProfileExport(Instrumenter *this,size_t numFuncs)

{
  undefined8 *puVar1;
  StorageKind SVar2;
  Module *pMVar3;
  pointer puVar4;
  __uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_> _Var5;
  undefined8 uVar6;
  uintptr_t uVar7;
  pointer puVar8;
  pointer puVar9;
  _Head_base<0UL,_wasm::Function_*,_false> _Var10;
  ulong uVar11;
  char *pcVar12;
  _Head_base<0UL,_wasm::Memory_*,_false> _Var13;
  Type type;
  Const *pCVar14;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  Expression *pEVar18;
  undefined4 *puVar19;
  Expression *pEVar20;
  Expression *value;
  Store *pSVar21;
  LocalSet *args;
  Break *args_1;
  Block *pBVar22;
  undefined1 (*pauVar23) [16];
  pointer puVar24;
  bool bVar25;
  int x;
  Address AVar26;
  long lVar27;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  Signature SVar28;
  Name NVar29;
  Name root;
  undefined1 auVar30 [16];
  Name NVar31;
  string_view sVar32;
  Expression EVar33;
  Expression EVar34;
  string_view sVar35;
  Name name;
  Name name_00;
  HeapType local_f8;
  Type local_f0;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  Name loadMemoryName;
  __single_object export__1;
  undefined1 auStack_78 [8];
  __single_object memory;
  Store *local_58;
  _Head_base<0UL,_wasm::Function_*,_false> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> writeProfile;
  Builder local_40;
  Builder builder;
  
  pMVar3 = this->wasm;
  auVar30 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  NVar31.super_IString.str._M_str = (char *)auStack_78;
  NVar31.super_IString.str._M_len = auVar30._8_8_;
  auStack_78 = (undefined1  [8])pMVar3;
  NVar31 = Names::getValidName(auVar30._0_8_,NVar31,(function<bool_(wasm::Name)> *)auStack_78);
  std::
  _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:72:11)>
  ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
  local_40.wasm = (Module *)0x2;
  builder.wasm = (Module *)0x2;
  wasm::Type::Type(&local_f0,&local_40,2);
  SVar28.results.id = 2;
  SVar28.params.id = local_f0.id;
  wasm::HeapType::HeapType(&local_f8,SVar28);
  auStack_78 = (undefined1  [8])0x0;
  memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
  super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
       (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
       (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
  name.super_IString.str._M_str = NVar31.super_IString.str._M_len;
  name.super_IString.str._M_len = (size_t)&local_50;
  Builder::makeFunction
            (name,(HeapType)NVar31.super_IString.str._M_str,
             (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_f8.id,(Expression *)auStack_78
            );
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,-(long)auStack_78);
  }
  _Var10._M_head_impl = local_50._M_head_impl;
  ((local_50._M_head_impl)->super_Importable).super_Named.hasExplicitName = true;
  uVar11 = wasm::IString::interned(4,"addr",0);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = uVar11;
  wasm::Function::setLocalName((uint)_Var10._M_head_impl,(Name)(auVar30 << 0x40));
  _Var10._M_head_impl = local_50._M_head_impl;
  pcVar12 = (char *)wasm::IString::interned(4,"size",0);
  NVar29.super_IString.str._M_str = pcVar12;
  NVar29.super_IString.str._M_len = 1;
  wasm::Function::setLocalName((uint)_Var10._M_head_impl,NVar29);
  pMVar3 = this->wasm;
  AVar26.addr = numFuncs * 4 + 0x10007 >> 0x10;
  puVar4 = (pMVar3->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40.wasm = pMVar3;
  if (puVar4 == (pMVar3->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    auVar30 = wasm::IString::interned(1,"0",0);
    auStack_78 = (undefined1  [8])operator_new(0x58);
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x40) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x40) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x30) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x30) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x20) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x20) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x10) = 0;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x10) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])auStack_78 = 0;
    *(undefined8 *)((long)*(undefined1 (*) [16])auStack_78 + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x40) = 0x10000;
    (*(undefined1 (*) [16])((long)auStack_78 + 0x40))[8] = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x50) = 2;
    *(undefined1 (*) [16])auStack_78 = auVar30;
    *(undefined8 *)(*(undefined1 (*) [16])((long)auStack_78 + 0x30) + 8) = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x40) = 0x10000;
    (*(undefined1 (*) [16])((long)auStack_78 + 0x40))[8] = 0;
    *(undefined8 *)*(undefined1 (*) [16])((long)auStack_78 + 0x50) = 2;
    wasm::Module::addMemory((unique_ptr *)pMVar3);
    if (auStack_78 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_78,0x58);
    }
    _Var13._M_head_impl =
         *(Memory **)
          &(((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>;
    ((_Var13._M_head_impl)->initial).addr = AVar26.addr;
LAB_0011da38:
    ((Address *)((long)_Var13._M_head_impl + 0x40))->addr = AVar26.addr;
  }
  else {
    _Var13._M_head_impl =
         (puVar4->_M_t).super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
         super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    if ((((_Var13._M_head_impl)->initial).addr < AVar26.addr) &&
       (((_Var13._M_head_impl)->initial).addr = AVar26.addr,
       ((_Var13._M_head_impl)->max).addr < AVar26.addr)) goto LAB_0011da38;
  }
  type.id = (uintptr_t)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  ((Expression *)type.id)->_id = LocalGetId;
  ((Expression *)(type.id + 0x10))->_id = InvalidId;
  (((Expression *)type.id)->type).id = 2;
  pCVar14 = Builder::makeConst<long>(&local_40,this->moduleHash);
  local_58 = Builder::makeStore(&local_40,8,(Address)0x0,1,(Expression *)type.id,
                                (Expression *)pCVar14,(Type)0x3,
                                (Name)*(string_view *)
                                       (((this->wasm->memories).
                                         super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                       super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                       ._M_t);
  _Var10._M_head_impl = local_50._M_head_impl;
  SVar2 = this->config->storageKind;
  if (SVar2 - InMemory < 2) {
    auVar30 = wasm::IString::interned(7,"funcIdx",0);
    name_00.super_IString.str._M_len = auVar30._8_8_;
    name_00.super_IString.str._M_str = (char *)0x2;
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl._0_4_ =
         Builder::addVar((Builder *)_Var10._M_head_impl,auVar30._0_8_,name_00,type);
    if (this->config->storageKind == InMemory) {
      _Var15._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((this->wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    }
    else {
      _Var15._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (tuple<wasm::Memory_*,_std::default_delete<wasm::Memory>_>)&this->secondaryMemory;
    }
    uStack_e8 = *(undefined4 *)
                 _Var15._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl;
    uStack_e4 = *(undefined4 *)
                 ((long)_Var15._M_t.
                        super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                        super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 4);
    loadMemoryName.super_IString.str._M_len._0_4_ =
         *(undefined4 *)
          ((long)_Var15._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    loadMemoryName.super_IString.str._M_len._4_4_ =
         *(undefined4 *)
          ((long)_Var15._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0xc);
    sVar32 = (string_view)wasm::IString::interned(5,"outer",0);
    EVar33 = (Expression)wasm::IString::interned(1,"l",0);
    EVar34 = (Expression)wasm::IString::interned(5,"outer",0);
    puVar16 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar16 = 8;
    puVar16[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar16 + 2) = 2;
    pCVar14 = Builder::makeConst<unsigned_int>(&local_40,(uint)numFuncs);
    puVar17 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar17 = 0x10;
    *(undefined8 *)(puVar17 + 2) = 0;
    puVar17[4] = 0xf;
    *(undefined4 **)(puVar17 + 6) = puVar16;
    *(Const **)(puVar17 + 8) = pCVar14;
    wasm::Binary::finalize();
    pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    pEVar18->_id = BreakId;
    (pEVar18->type).id = 0;
    *(undefined8 *)(pEVar18 + 1) = 0;
    pEVar18[1].type.id = 0;
    *(undefined8 *)(pEVar18 + 2) = 0;
    (pEVar18->type).id = 1;
    pEVar18[1] = EVar34;
    *(undefined8 *)(pEVar18 + 2) = 0;
    pEVar18[2].type.id = (uintptr_t)puVar17;
    wasm::Break::finalize();
    puVar16 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar16 = 8;
    puVar16[4] = 0;
    *(undefined8 *)(puVar16 + 2) = 2;
    puVar17 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar17 = 8;
    puVar17[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar17 + 2) = 2;
    pCVar14 = Builder::makeConst<unsigned_int>(&local_40,4);
    puVar19 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    *puVar19 = 0x10;
    *(undefined8 *)(puVar19 + 2) = 0;
    puVar19[4] = 2;
    *(undefined4 **)(puVar19 + 6) = puVar17;
    *(Const **)(puVar19 + 8) = pCVar14;
    wasm::Binary::finalize();
    pEVar20 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar20->_id = BinaryId;
    (pEVar20->type).id = 0;
    pEVar20[1]._id = InvalidId;
    pEVar20[1].type.id = (uintptr_t)puVar16;
    *(undefined4 **)(pEVar20 + 2) = puVar19;
    wasm::Binary::finalize();
    puVar16 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar16 = 8;
    puVar16[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar16 + 2) = 2;
    value = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x48,8);
    value->_id = LoadId;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 0;
    *(undefined1 *)&value[2].type.id = 0;
    *(undefined2 *)&value[1]._id = BlockId;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 1;
    *(undefined4 **)(value + 3) = puVar16;
    (value->type).id = 2;
    value[3].type.id = CONCAT44(uStack_e4,uStack_e8);
    *(ulong *)(value + 4) =
         CONCAT44(loadMemoryName.super_IString.str._M_len._4_4_,
                  (undefined4)loadMemoryName.super_IString.str._M_len);
    *(undefined1 *)&value[2].type.id = 1;
    pSVar21 = Builder::makeStore(&local_40,4,(Address)0x8,4,pEVar20,value,(Type)0x2,
                                 (Name)*(string_view *)
                                        (((this->wasm->memories).
                                          super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                        super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                        ._M_t);
    puVar16 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
    *puVar16 = 8;
    puVar16[4] = (Index)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    *(undefined8 *)(puVar16 + 2) = 2;
    pCVar14 = Builder::makeConst<unsigned_int>(&local_40,1);
    pEVar20 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar20->_id = BinaryId;
    (pEVar20->type).id = 0;
    pEVar20[1]._id = InvalidId;
    pEVar20[1].type.id = (uintptr_t)puVar16;
    *(Const **)(pEVar20 + 2) = pCVar14;
    wasm::Binary::finalize();
    args = Builder::makeLocalSet
                     (&local_40,
                      (Index)writeProfile._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,pEVar20);
    sVar35 = (string_view)wasm::IString::interned(1,"l",0);
    args_1 = (Break *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x30,8);
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id = BreakId;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 0;
    (args_1->name).super_IString.str._M_len = 0;
    (args_1->name).super_IString.str._M_str = (char *)0x0;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    (args_1->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression.type.id = 1;
    (args_1->name).super_IString.str = sVar35;
    args_1->value = (Expression *)0x0;
    args_1->condition = (Expression *)0x0;
    wasm::Break::finalize();
    pBVar22 = Builder::blockify<wasm::LocalSet*,wasm::Break*>
                        (&local_40,pEVar18,(Expression *)pSVar21,args,args_1);
    pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
    pEVar18->_id = LoopId;
    (pEVar18->type).id = 0;
    *(undefined8 *)(pEVar18 + 1) = 0;
    pEVar18[1] = EVar33;
    *(Block **)(pEVar18 + 2) = pBVar22;
    wasm::Loop::finalize();
    pBVar22 = Builder::makeBlock(&local_40,pEVar18);
    (pBVar22->name).super_IString.str = sVar32;
    wasm::Block::finalize();
    local_58 = (Store *)Builder::blockify(&local_40,(Expression *)local_58,(Expression *)pBVar22);
  }
  else if (SVar2 == InGlobals) {
    writeProfile._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
    _M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_start;
    _Var5._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
         (this->functionGlobals).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if ((tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)
        writeProfile._M_t.
        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
        _Var5._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
        super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl) {
      lVar27 = 0;
      do {
        pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
        puVar1 = (undefined8 *)
                 ((long)writeProfile._M_t.
                        super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                        .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + lVar27 * 4);
        pEVar18->_id = LocalGetId;
        pEVar18[1]._id = InvalidId;
        (pEVar18->type).id = 2;
        uVar6 = *puVar1;
        uVar7 = puVar1[1];
        pEVar20 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x20,8);
        AVar26.addr._0_4_ = (int)lVar27 + 8;
        AVar26.addr._4_4_ = 0;
        pEVar20->_id = GlobalGetId;
        (pEVar20->type).id = 0;
        *(undefined8 *)(pEVar20 + 1) = 0;
        *(undefined8 *)(pEVar20 + 1) = uVar6;
        pEVar20[1].type.id = uVar7;
        (pEVar20->type).id = 2;
        pSVar21 = Builder::makeStore(&local_40,4,AVar26,1,pEVar18,pEVar20,(Type)0x2,
                                     (Name)*(string_view *)
                                            (((this->wasm->memories).
                                              super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                            ._M_t);
        local_58 = (Store *)Builder::blockify(&local_40,(Expression *)local_58,(Expression *)pSVar21
                                             );
        lVar27 = lVar27 + 4;
      } while ((tuple<wasm::Function_*,_std::default_delete<wasm::Function>_>)(puVar1 + 2) !=
               (_Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>)
               _Var5._M_t.
               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
               super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl);
    }
  }
  puVar16 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x18,8);
  *puVar16 = 8;
  puVar16[4] = 1;
  *(undefined8 *)(puVar16 + 2) = 2;
  x = (int)(numFuncs << 2) + 8;
  pCVar14 = Builder::makeConst<int>(&local_40,x);
  puVar17 = (undefined4 *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  *puVar17 = 0x10;
  *(undefined8 *)(puVar17 + 2) = 0;
  puVar17[4] = 0x18;
  *(undefined4 **)(puVar17 + 6) = puVar16;
  *(Const **)(puVar17 + 8) = pCVar14;
  wasm::Binary::finalize();
  pEVar18 = (Expression *)MixedArena::allocSpace(&(local_40.wasm)->allocator,0x28,8);
  pEVar18->_id = IfId;
  (pEVar18->type).id = 0;
  *(undefined8 *)(pEVar18 + 2) = 0;
  *(undefined4 **)(pEVar18 + 1) = puVar17;
  pEVar18[1].type.id = (uintptr_t)local_58;
  wasm::If::finalize();
  pCVar14 = Builder::makeConst<int>(&local_40,x);
  pBVar22 = Builder::makeBlock(&local_40,pEVar18);
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
            (&(pBVar22->list).
              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>,
             (Expression *)pCVar14);
  wasm::Block::finalize();
  (local_50._M_head_impl)->body = (Expression *)pBVar22;
  wasm::Module::addFunction((unique_ptr *)this->wasm);
  pMVar3 = this->wasm;
  auVar30 = wasm::IString::interned
                      ((this->config->profileExport)._M_string_length,
                       (this->config->profileExport)._M_dataplus._M_p,0);
  auStack_78 = (undefined1  [8])operator_new(0x28);
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((Module *)auStack_78)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Module *)auStack_78)->functions).
  super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)auVar30._0_8_;
  (((Module *)auStack_78)->exports).
  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)auVar30._8_8_;
  *(IString *)
   &(((Module *)auStack_78)->exports).
    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = NVar31.super_IString.str;
  *(undefined4 *)
   &(((Module *)auStack_78)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  wasm::Module::addExport((unique_ptr *)pMVar3);
  if (auStack_78 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_78,0x28);
  }
  pMVar3 = this->wasm;
  if (*(long *)((long)(((pMVar3->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> + 0x20
               ) == 0) {
    puVar8 = (pMVar3->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (pMVar3->exports).
             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar8 != puVar9) {
      do {
        puVar24 = puVar8 + 1;
        bVar25 = false;
        if (((puVar8->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Memory) {
          bVar25 = true;
          break;
        }
        puVar8 = puVar24;
      } while (puVar24 != puVar9);
      if (bVar25) goto LAB_0011e372;
    }
    auVar30 = wasm::IString::interned(0xe,"profile-memory",0);
    auStack_78 = (undefined1  [8])this->wasm;
    _Var15._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (((((Module *)auStack_78)->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
    memory._M_t.super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
    super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Memory,_std::default_delete<wasm::Memory>,_true,_true>)
         (__uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>)0x0;
    root.super_IString.str._M_str = auStack_78;
    root.super_IString.str._M_len =
         *(size_t *)
          ((long)_Var15._M_t.
                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
                 super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 8);
    NVar31 = Names::getValidName(*(Names **)
                                  _Var15._M_t.
                                  super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                  .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl,root,
                                 (function<bool_(wasm::Name)> *)
                                 _Var15._M_t.
                                 super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                                 .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl);
    std::
    _Function_handler<bool_(wasm::Name),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/names.h:64:23)>
    ::_M_manager((_Any_data *)auStack_78,(_Any_data *)auStack_78,__destroy_functor);
    pauVar23 = (undefined1 (*) [16])operator_new(0x28);
    *(undefined8 *)pauVar23[1] = 0;
    *(undefined8 *)(pauVar23[1] + 8) = 0;
    *(undefined8 *)*pauVar23 = 0;
    *(undefined8 *)((long)*pauVar23 + 8) = 0;
    *(undefined8 *)pauVar23[2] = 0;
    *pauVar23 = auVar30;
    *(IString *)pauVar23[1] = NVar31.super_IString.str;
    *(undefined4 *)pauVar23[2] = 2;
    wasm::Module::addExport((unique_ptr *)pMVar3);
    if (pauVar23 != (undefined1 (*) [16])0x0) {
      operator_delete(pauVar23,0x28);
    }
  }
LAB_0011e372:
  std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_50);
  return;
}

Assistant:

void Instrumenter::addProfileExport(size_t numFuncs) {
  // Create and export a function to dump the profile into a given memory
  // buffer. The function takes the available address and buffer size as
  // arguments and returns the total size of the profile. It only actually
  // writes the profile if the given space is sufficient to hold it.
  auto name = Names::getValidFunctionName(*wasm, config.profileExport);
  auto writeProfile = Builder::makeFunction(
    name, Signature({Type::i32, Type::i32}, Type::i32), {});
  writeProfile->hasExplicitName = true;
  writeProfile->setLocalName(0, "addr");
  writeProfile->setLocalName(1, "size");

  // Calculate the size of the profile:
  //   8 bytes module hash +
  //   4 bytes for the timestamp for each function
  const size_t profileSize = 8 + 4 * numFuncs;

  // Create the function body
  Builder builder(*wasm);
  auto getAddr = [&]() { return builder.makeLocalGet(0, Type::i32); };
  auto getSize = [&]() { return builder.makeLocalGet(1, Type::i32); };
  auto hashConst = [&]() { return builder.makeConst(int64_t(moduleHash)); };
  auto profileSizeConst = [&]() {
    return builder.makeConst(int32_t(profileSize));
  };

  // Also make sure there is a memory with enough pages to write into
  size_t pages = (profileSize + Memory::kPageSize - 1) / Memory::kPageSize;
  if (wasm->memories.empty()) {
    wasm->addMemory(Builder::makeMemory("0"));
    wasm->memories[0]->initial = pages;
    wasm->memories[0]->max = pages;
  } else if (wasm->memories[0]->initial < pages) {
    wasm->memories[0]->initial = pages;
    if (wasm->memories[0]->max < pages) {
      wasm->memories[0]->max = pages;
    }
  }

  // Write the hash followed by all the time stamps
  Expression* writeData = builder.makeStore(
    8, 0, 1, getAddr(), hashConst(), Type::i64, wasm->memories[0]->name);
  uint32_t offset = 8;

  switch (config.storageKind) {
    case WasmSplitOptions::StorageKind::InGlobals: {
      for (const auto& global : functionGlobals) {
        writeData = builder.blockify(
          writeData,
          builder.makeStore(4,
                            offset,
                            1,
                            getAddr(),
                            builder.makeGlobalGet(global, Type::i32),
                            Type::i32,
                            wasm->memories[0]->name));
        offset += 4;
      }
      break;
    }
    case WasmSplitOptions::StorageKind::InMemory:
    case WasmSplitOptions::StorageKind::InSecondaryMemory: {
      Index funcIdxVar =
        Builder::addVar(writeProfile.get(), "funcIdx", Type::i32);
      auto getFuncIdx = [&]() {
        return builder.makeLocalGet(funcIdxVar, Type::i32);
      };
      Name loadMemoryName =
        config.storageKind == WasmSplitOptions::StorageKind::InMemory
          ? wasm->memories[0]->name
          : secondaryMemory;
      // (block $outer
      //   (loop $l
      //     (br_if $outer (i32.eq (local.get $fucIdx) (i32.const numFuncs))
      //     (i32.store offset=8
      //       (i32.add
      //         (local.get $addr)
      //         (i32.mul (local.get $funcIdx) (i32.const 4))
      //       )
      //       (i32.atomic.load8_u (local.get $funcIdx))
      //     )
      //     (local.set $funcIdx
      //      (i32.add (local.get $fundIdx) (i32.const 1)
      //     )
      //     (br $l)
      //   )
      // )
      writeData = builder.blockify(
        writeData,
        builder.makeBlock(
          "outer",
          builder.makeLoop(
            "l",
            builder.blockify(
              builder.makeBreak(
                "outer",
                nullptr,
                builder.makeBinary(EqInt32,
                                   getFuncIdx(),
                                   builder.makeConst(uint32_t(numFuncs)))),
              builder.makeStore(
                4,
                offset,
                4,
                builder.makeBinary(
                  AddInt32,
                  getAddr(),
                  builder.makeBinary(
                    MulInt32, getFuncIdx(), builder.makeConst(uint32_t(4)))),
                builder.makeAtomicLoad(
                  1, 0, getFuncIdx(), Type::i32, loadMemoryName),
                Type::i32,
                wasm->memories[0]->name),
              builder.makeLocalSet(
                funcIdxVar,
                builder.makeBinary(
                  AddInt32, getFuncIdx(), builder.makeConst(uint32_t(1)))),
              builder.makeBreak("l")))));
      break;
    }
  }

  writeProfile->body = builder.makeSequence(
    builder.makeIf(builder.makeBinary(GeUInt32, getSize(), profileSizeConst()),
                   writeData),
    profileSizeConst());

  // Create an export for the function
  wasm->addFunction(std::move(writeProfile));
  wasm->addExport(
    Builder::makeExport(config.profileExport, name, ExternalKind::Function));

  // Export the memory if it is not already exported or imported.
  if (!wasm->memories[0]->imported()) {
    bool memoryExported = false;
    for (auto& ex : wasm->exports) {
      if (ex->kind == ExternalKind::Memory) {
        memoryExported = true;
        break;
      }
    }
    if (!memoryExported) {
      wasm->addExport(Builder::makeExport(
        "profile-memory",
        Names::getValidExportName(*wasm, wasm->memories[0]->name),
        ExternalKind::Memory));
    }
  }
}